

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O0

void light_pcapng_historgram
               (light_pcapng pcapng,_func_uint32_t_light_pcapng *key_master,light_pair **hist,
               size_t *size,size_t *rejected)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  ulong *in_RCX;
  long *in_RDX;
  code *in_RSI;
  long in_RDI;
  long *in_R8;
  int found;
  uint32_t key;
  size_t i;
  size_t sz;
  size_t dropped;
  light_pcapng iterator;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  local_38 = 0;
  local_40 = 0;
  *in_RDX = 0;
  local_30 = in_RDI;
  do {
    if (local_30 == 0) {
      *in_RCX = local_40;
      if (in_R8 != (long *)0x0) {
        *in_R8 = local_38;
      }
      return;
    }
    iVar2 = (*in_RSI)(local_30);
    if (iVar2 == -1) {
      local_38 = local_38 + 1;
    }
    else {
      bVar1 = false;
      for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
        if (*(int *)(*in_RDX + local_48 * 8) == iVar2) {
          bVar1 = true;
          *(int *)(*in_RDX + 4 + local_48 * 8) = *(int *)(*in_RDX + 4 + local_48 * 8) + 1;
          break;
        }
      }
      if (!bVar1) {
        pvVar3 = realloc((void *)*in_RDX,(local_40 + 1) * 8);
        *in_RDX = (long)pvVar3;
        *(int *)(*in_RDX + local_40 * 8) = iVar2;
        *(undefined4 *)(*in_RDX + 4 + local_40 * 8) = 1;
        local_40 = local_40 + 1;
      }
    }
    local_30 = *(long *)(local_30 + 0x18);
  } while( true );
}

Assistant:

void light_pcapng_historgram(const light_pcapng pcapng, uint32_t (*key_master)(const light_pcapng),
		light_pair **hist, size_t *size, size_t *rejected)
{
	light_pcapng iterator = pcapng;
	size_t dropped = 0;
	size_t sz = 0;
	size_t i;

	*hist = NULL;

	while (iterator != NULL) {
		uint32_t key = key_master(iterator);
		if (key != LIGHT_KEY_REJECTED) {
			int found = 0;
			for (i = 0; i < sz; ++i) {
				if ((*hist)[i].key == key) {
					found = 1;
					(*hist)[i].val++;
					break;
				}
			}

			if (found == 0) {
				*hist = realloc(*hist, (sz + 1) * sizeof(light_pair));
				(*hist)[sz].key = key;
				(*hist)[sz].val = 1;
				sz++;
			}
		}
		else {
			dropped++;
		}
		iterator = iterator->next_block;
	}

	*size = sz;

	if (rejected != NULL)
		*rejected = dropped;
}